

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O1

pboolean p_semaphore_acquire(PSemaphore *sem,PError **error)

{
  int iVar1;
  pint pVar2;
  uint uVar3;
  
  if (sem == (PSemaphore *)0x0) {
    p_semaphore_acquire_cold_2();
    uVar3 = 0;
  }
  else {
    do {
      iVar1 = sem_wait((sem_t *)sem->sem_hdl);
      if (iVar1 != -1) break;
      pVar2 = p_error_get_last_system();
    } while (pVar2 == 4);
    uVar3 = (uint)(iVar1 == 0);
    if (iVar1 != 0) {
      p_semaphore_acquire_cold_1();
    }
  }
  return uVar3;
}

Assistant:

P_LIB_API pboolean
p_semaphore_acquire (PSemaphore	*sem,
		     PError	**error)
{
	pboolean	ret;
	pint		res;

	if (P_UNLIKELY (sem == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	while ((res = sem_wait (sem->sem_hdl)) == -1 && p_error_get_last_system () == EINTR)
		;

	ret = (res == 0);

	if (P_UNLIKELY (ret == FALSE))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call sem_wait() on semaphore");

	return ret;
}